

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.cpp
# Opt level: O0

bool convert<float,short>(TWaveformT<float> *src,TWaveformT<short> *dst)

{
  short sVar1;
  value_type vVar2;
  size_type sVar3;
  const_reference pvVar4;
  reference pvVar5;
  vector<short,_std::allocator<short>_> *in_RSI;
  vector<float,_std::allocator<float>_> *in_RDI;
  double dVar6;
  int i;
  double iamax;
  double amax;
  undefined2 in_stack_ffffffffffffffc0;
  undefined2 in_stack_ffffffffffffffc2;
  undefined4 in_stack_ffffffffffffffc4;
  undefined8 local_38;
  undefined4 in_stack_ffffffffffffffd8;
  undefined4 in_stack_ffffffffffffffdc;
  int iVar7;
  int iVar8;
  vector<short,_std::allocator<short>_> *in_stack_ffffffffffffffe0;
  
  std::vector<float,_std::allocator<float>_>::size(in_RDI);
  std::vector<short,_std::allocator<short>_>::resize
            (in_stack_ffffffffffffffe0,CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8)
            );
  local_38 = calcAbsMax<float>((TWaveformT<float> *)
                               CONCAT44(in_stack_ffffffffffffffc4,
                                        CONCAT22(in_stack_ffffffffffffffc2,in_stack_ffffffffffffffc0
                                                )));
  if ((local_38 != 0.0) || (NAN(local_38))) {
    local_38 = 1.0 / local_38;
  }
  else {
    local_38 = 1.0;
  }
  iVar7 = 0;
  while( true ) {
    iVar8 = iVar7;
    sVar3 = std::vector<float,_std::allocator<float>_>::size(in_RDI);
    if ((int)sVar3 <= iVar7) break;
    sVar1 = std::numeric_limits<short>::max();
    pvVar4 = std::vector<float,_std::allocator<float>_>::operator[](in_RDI,(long)iVar8);
    dVar6 = round((double)(int)sVar1 * (double)*pvVar4 * local_38);
    vVar2 = (value_type)(int)dVar6;
    pvVar5 = std::vector<short,_std::allocator<short>_>::operator[](in_RSI,(long)iVar8);
    *pvVar5 = vVar2;
    iVar7 = iVar8 + 1;
  }
  return true;
}

Assistant:

bool convert(const TWaveformT<TSampleSrc> & src, TWaveformT<TSampleDst> & dst) {
    static_assert(std::is_same<TSampleSrc, TSampleDst>::value == false, "Required different sample types");

    static_assert(std::is_same<TSampleSrc, TSampleF>::value, "Source sample type not supported");
    static_assert(std::is_same<TSampleDst, TSampleI16>::value, "Destination sample type not supported");

    dst.resize(src.size());

    double amax = calcAbsMax(src);
    double iamax = amax != 0.0 ? 1.0/amax : 1.0;
    for (auto i = 0; i < (int) src.size(); ++i) dst[i] = std::round(std::numeric_limits<TSampleDst>::max()*(src[i]*iamax));

    return true;
}